

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedIdentifiers
          (Parser *this,EnumDescriptorProto *proto,LocationRecorder *parent_location)

{
  int value;
  bool bVar1;
  string *output;
  string_view text;
  string_view text_00;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  do {
    value = *(int *)((long)&proto->field_0 + 0x40);
    LocationRecorder::Init(&LStack_48,parent_location,parent_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,value);
    output = (string *)
             internal::RepeatedPtrFieldBase::AddString
                       (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x3d7f47));
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (!bVar1) {
      return false;
    }
    text._M_str = ",";
    text._M_len = 1;
    bVar1 = TryConsume(this,text);
  } while (bVar1);
  text_00._M_str = ";";
  text_00._M_len = 1;
  bVar1 = ConsumeEndOfDeclaration(this,text_00,parent_location);
  return bVar1;
}

Assistant:

bool Parser::ParseReservedIdentifiers(EnumDescriptorProto* proto,
                                      const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, proto->reserved_name_size());
    DO(ParseReservedIdentifier(proto->add_reserved_name(),
                               "Expected enum value identifier."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}